

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O0

ssize_t get_line(uchar *b,ssize_t avail,ssize_t *nlsize)

{
  long local_30;
  ssize_t len;
  ssize_t *nlsize_local;
  ssize_t avail_local;
  uchar *b_local;
  
  local_30 = 0;
  avail_local = (ssize_t)b;
  do {
    if (avail <= local_30) {
      if (nlsize != (ssize_t *)0x0) {
        *nlsize = 0;
      }
      return avail;
    }
    switch(""[*(byte *)avail_local]) {
    case '\0':
      if (nlsize != (ssize_t *)0x0) {
        *nlsize = 0;
      }
      return -1;
    case '\x01':
      avail_local = avail_local + 1;
      local_30 = local_30 + 1;
    default:
      break;
    case '\r':
      if ((1 < avail - local_30) && (*(char *)(avail_local + 1) == '\n')) {
        if (nlsize != (ssize_t *)0x0) {
          *nlsize = 2;
        }
        return local_30 + 2;
      }
    case '\n':
      if (nlsize != (ssize_t *)0x0) {
        *nlsize = 1;
      }
      return local_30 + 1;
    }
  } while( true );
}

Assistant:

static ssize_t
get_line(const unsigned char *b, ssize_t avail, ssize_t *nlsize)
{
	ssize_t len;

	len = 0;
	while (len < avail) {
		switch (ascii[*b]) {
		case 0:	/* Non-ascii character or control character. */
			if (nlsize != NULL)
				*nlsize = 0;
			return (-1);
		case '\r':
			if (avail-len > 1 && b[1] == '\n') {
				if (nlsize != NULL)
					*nlsize = 2;
				return (len+2);
			}
			/* FALL THROUGH */
		case '\n':
			if (nlsize != NULL)
				*nlsize = 1;
			return (len+1);
		case 1:
			b++;
			len++;
			break;
		}
	}
	if (nlsize != NULL)
		*nlsize = 0;
	return (avail);
}